

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte bVar1;
  ushort *p_00;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  MessageLite *pMVar6;
  undefined8 extraout_RAX;
  undefined4 extraout_var;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ushort *p_01;
  ParseContext *this_00;
  ExtensionInfo *extension_00;
  char *p;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_int> pVar15;
  StringPiece val;
  bool was_packed_on_wire;
  string payload;
  char *p_1;
  ExtensionInfo extension;
  ParseContext tmp_ctx;
  ushort *local_118;
  bool local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined **local_e0;
  char *local_d8;
  ExtensionInfo local_d0;
  ParseContext local_a8;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_e0 = &PTR__ExtensionFinder_00491878;
  uVar5 = 0;
  uVar13 = 0;
  local_118 = (ushort *)ptr;
LAB_00391d4d:
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(local_e8._4_4_,(int)uVar5);
  do {
    this_00 = ctx;
    bVar3 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_118,ctx->group_depth_);
    p_00 = local_118;
    p_01 = local_118;
    if (bVar3) goto LAB_00392048;
    p_01 = (ushort *)((long)local_118 + 1);
    bVar1 = (byte)*local_118;
    uVar10 = (uint)bVar1;
    if (bVar1 == 0x1a) {
      if ((int)uVar13 == 0) break;
      local_118 = p_01;
      local_118 = (ushort *)
                  ParseField(this,(uVar13 & 0xffffffff) * 8 + 2,(char *)p_01,extendee,metadata,ctx);
      uVar13 = 0;
    }
    else {
      if (bVar1 == 0x10) {
        uVar7 = (uint)(char)*p_01;
        uVar10 = *p_01 + uVar7;
        uVar11 = uVar7 * 2 & uVar10;
        uVar12 = uVar11 >> 1;
        uVar13 = (ulong)uVar12;
        if ((short)uVar11 < 0) {
          uVar13 = (ulong)uVar12;
          p_01 = (ushort *)((long)local_118 + 3);
          lVar9 = 0xd;
          goto LAB_00391fd5;
        }
        bVar3 = uVar10 < uVar7;
        goto LAB_00391e3f;
      }
      if ((char)bVar1 < '\0') {
        uVar10 = ((uint)bVar1 + (uint)*(byte *)p_01 * 0x80) - 0x80;
        if ((char)*(byte *)p_01 < '\0') {
          local_118 = p_01;
          pVar14 = ReadTagFallback((char *)p_00,uVar10);
          uVar10 = pVar14.second;
          p_01 = (ushort *)pVar14.first;
        }
        else {
          p_01 = local_118 + 1;
        }
      }
      local_118 = p_01;
      if ((uVar10 == 0) || ((uVar10 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
        goto LAB_00392048;
      }
      local_118 = (ushort *)ParseField(this,(ulong)uVar10,(char *)p_01,extendee,metadata,ctx);
    }
    if (local_118 == (ushort *)0x0) goto LAB_00392045;
  } while( true );
  bVar1 = *(byte *)p_01;
  uVar10 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    local_118 = p_01;
    pVar15 = ReadSizeFallback((char *)p_01,(uint)bVar1);
    uVar10 = pVar15.second;
    local_118 = (ushort *)pVar15.first;
    if (local_118 == (ushort *)0x0) goto LAB_00392045;
  }
  else {
    local_118 = local_118 + 1;
  }
  local_118 = (ushort *)
              EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)local_118,uVar10,&local_108);
  uVar13 = 0;
  uVar5 = CONCAT71((int7)((ulong)local_118 >> 8),1);
  if (local_118 == (ushort *)0x0) {
LAB_00392045:
    p_01 = (ushort *)0x0;
LAB_00392048:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    return (char *)p_01;
  }
  goto LAB_00391d4d;
LAB_00391fd5:
  uVar7 = (uint)(char)*p_01;
  uVar10 = *p_01 + uVar7;
  uVar11 = uVar7 * 2 & uVar10;
  this_00 = (ParseContext *)(ulong)uVar11;
  uVar13 = ((long)((long)&this_00[-1].data_.arena + 6) << ((byte)lVar9 & 0x3f)) + uVar13;
  if (-1 < (short)uVar11) goto LAB_00392006;
  lVar9 = lVar9 + 0xe;
  p_01 = p_01 + 1;
  if (lVar9 == 0x45) {
    local_118 = (ushort *)0x0;
    goto LAB_00392045;
  }
  goto LAB_00391fd5;
LAB_00392006:
  bVar3 = uVar10 < uVar7;
LAB_00391e3f:
  local_118 = (ushort *)((long)p_01 + (ulong)bVar3 + 1);
  uVar5 = 0;
  if (((ulong)local_e8 & 1) != 0) {
    local_d0.number = 0;
    local_d0.type = '\0';
    local_d0.is_repeated = false;
    local_d0.is_packed = false;
    local_d0.message._0_7_ = 0;
    local_d0.message._7_1_ = 0;
    local_d0.descriptor = (FieldDescriptor *)0x0;
    local_d0.field_5.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
    local_d0.field_5.enum_validity_check.arg = (void *)0x0;
    local_a8.super_EpsCopyInputStream.limit_end_ = (char *)local_e0;
    iVar4 = (int)uVar13;
    extension_00 = &local_d0;
    local_a8.super_EpsCopyInputStream.buffer_end_ = (char *)extendee;
    bVar3 = FindExtensionInfoFromFieldNumber
                      ((ExtensionSet *)this_00,2,iVar4,(ExtensionFinder *)&local_a8,extension_00,
                       &local_109);
    sVar2 = local_108._M_string_length;
    if (bVar3) {
      if (local_d0.is_repeated == true) {
        pMVar6 = AddMessage(this,iVar4,'\v',(MessageLite *)local_d0.field_5.enum_validity_check.func
                            ,local_d0.descriptor);
      }
      else {
        pMVar6 = MutableMessage(this,iVar4,'\v',
                                (MessageLite *)local_d0.field_5.enum_validity_check.func,
                                local_d0.descriptor);
      }
      ParseContext::ParseContext<std::__cxx11::string&>
                (&local_a8,ctx->depth_,false,&local_d8,&local_108);
      local_a8.data_.pool._0_4_ = *(undefined4 *)&(ctx->data_).pool;
      local_a8.data_.pool._4_4_ = *(undefined4 *)((long)&(ctx->data_).pool + 4);
      local_a8.data_.factory._0_4_ = *(undefined4 *)&(ctx->data_).factory;
      local_a8.data_.factory._4_4_ = *(undefined4 *)((long)&(ctx->data_).factory + 4);
      iVar4 = (*pMVar6->_vptr_MessageLite[10])(pMVar6,local_d8,&local_a8);
      if (CONCAT44(extraout_var,iVar4) == 0) goto LAB_00392045;
      uVar13 = 0;
      uVar5 = CONCAT71((int7)((ulong)CONCAT44(extraout_var,iVar4) >> 8),1);
      if (local_a8.super_EpsCopyInputStream.last_tag_minus_1_ != 0) goto LAB_00392045;
    }
    else {
      local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_108._M_dataplus._M_p;
      if ((long)local_108._M_string_length < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_108._M_string_length,"string length exceeds max size");
      }
      if ((metadata->ptr_ & 1U) == 0) {
        pbVar8 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(metadata);
      }
      else {
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((metadata->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      val.length_ = (size_type)pbVar8;
      val.ptr_ = (char *)sVar2;
      WriteLengthDelimited
                ((internal *)(uVar13 & 0xffffffff),(uint32_t)local_e8,val,(string *)extension_00);
      uVar13 = 0;
      uVar5 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
  }
  goto LAB_00391d4d;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  bool payload_read = false;
  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (payload_read) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        payload_read = true;
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}